

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

char * __thiscall regexsearcher::search(regexsearcher *this,char *first,char *last,CallbackType *cb)

{
  bool bVar1;
  value_type *this_00;
  const_reference that;
  undefined1 local_88 [8];
  value_type m;
  char *maxmatch;
  char *maxpartial;
  undefined1 local_50 [8];
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> b;
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> a;
  CallbackType *cb_local;
  char *last_local;
  char *first_local;
  regexsearcher *this_local;
  
  boost::
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
  regex_iterator((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                  *)&b.pdata.pn,first,last,&this->re,match_partial);
  boost::
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
  regex_iterator((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                  *)local_50);
  maxmatch = (char *)0x0;
  m.matched = false;
  m._17_7_ = 0;
  do {
    bVar1 = boost::
            regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
            ::operator!=((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)&b.pdata.pn,
                         (regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)local_50);
    if (!bVar1) {
      this_local = (regexsearcher *)last;
      if (((m._16_8_ != 0) || (maxmatch != (char *)0x0)) && ((ulong)m._16_8_ <= maxmatch)) {
        this_local = (regexsearcher *)maxmatch;
      }
LAB_00122b68:
      boost::
      regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
      ::~regex_iterator((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                         *)local_50);
      boost::
      regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
      ::~regex_iterator((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                         *)&b.pdata.pn);
      return (char *)this_local;
    }
    this_00 = boost::
              regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
              ::operator*((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                           *)&b.pdata.pn);
    that = boost::match_results<const_char_*,_std::allocator<boost::sub_match<const_char_*>_>_>::
           operator[](this_00,0);
    boost::sub_match<const_char_*>::sub_match((sub_match<const_char_*> *)local_88,that,true);
    if (((byte)m.super_pair<const_char_*,_const_char_*>.second & 1) == 0) {
      if ((maxmatch == (char *)0x0) || (maxmatch < (ulong)local_88)) {
        maxmatch = (char *)local_88;
      }
    }
    else {
      bVar1 = std::function<bool_(const_char_*,_const_char_*)>::operator()
                        (cb,(char *)local_88,m.super_pair<const_char_*,_const_char_*>.first);
      if (!bVar1) {
        this_local = (regexsearcher *)0x0;
        goto LAB_00122b68;
      }
      if ((m._16_8_ == 0) || ((ulong)m._16_8_ < (ulong)local_88)) {
        m._16_8_ = local_88;
      }
    }
    boost::
    regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    operator++((regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                *)&b.pdata.pn);
  } while( true );
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        REGEX_ITER<const char*> a(first, last, re   PARTIALARG);
        REGEX_ITER<const char*> b;

        const char *maxpartial = NULL;
        const char *maxmatch = NULL;

        //printf("searchrange(%p, %p)\n", first, last);
        while (a != b) {
            auto m = (*a)[0];
            //printf("    match %d  %p..%p\n", m.matched, m.first, m.second);
            if (m.matched) {
                if (!cb(m.first, m.second)) {
                    //printf("searchrange: stopping\n");
                    return NULL;
                }
                if (maxmatch == NULL || maxmatch < m.first)
                    maxmatch = m.first;
            }
            else {
                if (maxpartial == NULL || maxpartial < m.first)
                    maxpartial = m.first;
            }

            ++a;
        }
        if ((maxmatch == NULL && maxpartial == NULL) || maxmatch > maxpartial) {
            //printf("searchrange: no partial match\n");
            return last;
        }

        //printf("searchrange: partial match @%lx\n", maxpartial-first);
        return maxpartial;
    }